

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QRhiGles2::DeferredReleaseEntry>::erase
          (QPodArrayOps<QRhiGles2::DeferredReleaseEntry> *this,DeferredReleaseEntry *b,qsizetype n)

{
  DeferredReleaseEntry *__src;
  DeferredReleaseEntry *pDVar1;
  DeferredReleaseEntry *pDVar2;
  long lVar3;
  
  __src = b + n;
  pDVar2 = (this->super_QArrayDataPointer<QRhiGles2::DeferredReleaseEntry>).ptr;
  lVar3 = (this->super_QArrayDataPointer<QRhiGles2::DeferredReleaseEntry>).size;
  pDVar1 = pDVar2 + lVar3;
  if (__src == pDVar1 || pDVar2 != b) {
    if (__src != pDVar1) {
      memmove(b,__src,(long)pDVar1 - (long)__src);
      lVar3 = (this->super_QArrayDataPointer<QRhiGles2::DeferredReleaseEntry>).size;
    }
  }
  else {
    (this->super_QArrayDataPointer<QRhiGles2::DeferredReleaseEntry>).ptr = __src;
  }
  (this->super_QArrayDataPointer<QRhiGles2::DeferredReleaseEntry>).size = lVar3 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }